

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O1

int32_t __thiscall
llama_vocab::impl::detokenize
          (impl *this,llama_token *tokens,int32_t n_tokens,char *text,int32_t text_len_max,
          bool remove_special,bool unparse_special)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  undefined8 uVar8;
  uint uVar9;
  long lVar10;
  int32_t length;
  ulong uVar11;
  
  if (this->type == LLAMA_VOCAB_TYPE_NONE) {
    uVar3 = 0;
  }
  else {
    if ((this->tokenizer)._M_t.
        super___uniq_ptr_impl<llm_tokenizer,_std::default_delete<llm_tokenizer>_>._M_t.
        super__Tuple_impl<0UL,_llm_tokenizer_*,_std::default_delete<llm_tokenizer>_>.
        super__Head_base<0UL,_llm_tokenizer_*,_false>._M_head_impl == (llm_tokenizer *)0x0) {
      pcVar6 = 
      "tokenizer && \"Tokenizer not initialized. Call llama_vocab::init_tokenizer() first.\"";
      uVar8 = 0xa4f;
LAB_00218470:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-vocab.cpp"
                 ,uVar8,"GGML_ASSERT(%s) failed",pcVar6);
    }
    bVar2 = this->add_space_prefix;
    if ((((remove_special) && (0 < n_tokens)) && (this->add_bos != false)) &&
       (*tokens == this->special_bos_id)) {
      n_tokens = n_tokens - 1;
      tokens = tokens + 1;
      bVar2 = 0;
    }
    if (((remove_special) && ((0 < n_tokens & this->add_eos) == 1)) &&
       (tokens[n_tokens - 1U] == this->special_eos_id)) {
      n_tokens = n_tokens - 1U;
    }
    if (n_tokens < 1) {
      uVar7 = 0;
    }
    else {
      uVar3 = (uint)bVar2;
      uVar11 = 0;
      uVar7 = 0;
      length = text_len_max;
      do {
        if (length < 0) {
          pcVar6 = "avail >= 0";
          uVar8 = 0xa66;
          goto LAB_00218470;
        }
        uVar3 = token_to_piece(this,tokens[uVar11],text,length,uVar3,unparse_special);
        if ((int)uVar3 < 0) {
          uVar7 = (ulong)((int)uVar7 - uVar3);
          length = 0;
        }
        else if (uVar3 != 0) {
          length = length - uVar3;
          text = text + uVar3;
          uVar7 = (ulong)((int)uVar7 + uVar3);
        }
        uVar11 = uVar11 + 1;
        uVar3 = 0;
      } while ((uint)n_tokens != uVar11);
    }
    uVar9 = (uint)uVar7;
    if (text_len_max < (int)uVar9) {
      uVar3 = -uVar9;
    }
    else {
      if (this->clean_spaces == true) {
        uVar3 = (uint)(uVar9 != 0);
        if (1 < (int)uVar9) {
          lVar5 = 1 - uVar7;
          uVar3 = (uint)(uVar9 != 0);
          do {
            bVar2 = text[lVar5];
            if (((text[lVar5 + -1] == ' ') && (bVar2 < 0x40)) &&
               ((0x8000500200000000U >> ((ulong)(uint)bVar2 & 0x3f) & 1) != 0)) {
              uVar3 = uVar3 - 1;
            }
            lVar10 = (long)(int)uVar3;
            uVar3 = uVar3 + 1;
            text[lVar10 - uVar7] = bVar2;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0);
        }
        uVar4 = (uint)(uVar3 != 0);
        if (1 < (int)uVar3) {
          uVar9 = 1;
          uVar4 = (uint)(uVar3 != 0);
          do {
            lVar5 = (long)(int)uVar9;
            cVar1 = text[lVar5 - uVar7];
            if ((((cVar1 == '\'') && (uVar11 = lVar5 + 1, (int)uVar11 < (int)uVar3)) &&
                (text[lVar5 + (-1 - uVar7)] == ' ')) && (text[uVar11 - uVar7] == ' ')) {
              uVar4 = uVar4 - 1;
              text[uVar11 - uVar7] = '\0';
            }
            else {
              uVar11 = (ulong)uVar9;
            }
            lVar5 = (long)(int)uVar4;
            uVar4 = uVar4 + 1;
            text[lVar5 - uVar7] = cVar1;
            uVar9 = (int)uVar11 + 1;
          } while ((int)uVar9 < (int)uVar3);
        }
        uVar9 = (uint)(uVar4 != 0);
        if (1 < (int)uVar4) {
          lVar5 = 3;
          uVar9 = (uint)(uVar4 != 0);
          do {
            if (((text[lVar5 + (-3 - uVar7)] == ' ') && (text[lVar5 + (-2 - uVar7)] == '\'')) &&
               ((lVar5 - 1U < (ulong)uVar4 &&
                (bVar2 = text[lVar5 + (-1 - uVar7)], (bVar2 & 0xef) != 100)))) {
              if ((bVar2 == 0x73) || (bVar2 == 0x6d)) {
                uVar9 = uVar9 - 1;
              }
              else if (((int)lVar5 < (int)uVar4) &&
                      ((bVar2 != 0x6c || (text[lVar5 - uVar7] != 'l')))) {
                uVar9 = uVar9 - ((bVar2 & 0xfb) == 0x72 && text[lVar5 - uVar7] == 'e');
              }
            }
            lVar10 = (long)(int)uVar9;
            uVar9 = uVar9 + 1;
            text[lVar10 - uVar7] = text[lVar5 + (-2 - uVar7)];
            lVar10 = lVar5 - (ulong)uVar4;
            lVar5 = lVar5 + 1;
          } while (lVar10 != 1);
        }
      }
      uVar3 = -uVar9;
      if ((int)uVar9 <= text_len_max) {
        uVar3 = uVar9;
      }
    }
  }
  return uVar3;
}

Assistant:

int32_t llama_vocab::impl::detokenize(
               const llama_token * tokens,
                         int32_t   n_tokens,
                            char * text,
                         int32_t   text_len_max,
                            bool   remove_special,
                            bool   unparse_special) const {
    if (type == LLAMA_VOCAB_TYPE_NONE) {
        return 0;
    }

    GGML_ASSERT(tokenizer && "Tokenizer not initialized. Call llama_vocab::init_tokenizer() first.");

    int32_t avail = text_len_max;
    int32_t total = 0;

    // remove the leading space
    bool remove_space = add_space_prefix;

    if (remove_special && add_bos) {
        if (n_tokens > 0 && tokens[0] == special_bos_id) {
            remove_space = false;
            n_tokens--;
            tokens++;
        }
    }

    if (remove_special && add_eos) {
        if (n_tokens > 0 && tokens[n_tokens - 1] == special_eos_id) {
            n_tokens--;
        }
    }

    for (int32_t i = 0; i < n_tokens; ++i) {
        GGML_ASSERT(avail >= 0);
        int32_t n_chars = token_to_piece(tokens[i], text, avail, remove_space, unparse_special);
        remove_space = false;
        if (n_chars < 0) {
            avail = 0;
            total -= n_chars;
        } else if (n_chars > 0) {
            avail -= n_chars;
            text  += n_chars;
            total += n_chars;
        }
    }

    if (total > text_len_max) {
        return -total;
    }

    if (clean_spaces) {
        text -= total;  // restart text

        // first pass: characters ?!.,  //TODO: where do these characters come from?
        const int32_t total1 = total;
        total = total ? 1 : 0;
        for (int32_t i = 1; i < total1; ++i) {
            const char x = text[i];
            if (text[i - 1] == ' ') {
                if (x == '?' || x == '!' || x == '.' || x == ',') {  // " ?", " !", " .", " ,"
                    total--;  // remove space
                }
            }
            text[total++] = x;
        }

        // second pass: strip single apostrophe between spaces
        const int32_t total2 = total;
        total = total ? 1 : 0;
        for (int32_t i = 1; i < total2; ++i) {
            const char x = text[i];
            if (x == '\'' && i + 1 < total2 && text[i - 1] == ' ' && text[i + 1] == ' ') {  // " ' "
                total--;           // remove prev space
                text[++i] = '\0';  // remove next space
            }
            text[total++] = x;
        }

        // third pass: apostrophe contractions  //NOTE: this makes sense?
        const int32_t total3 = total;
        total = total ? 1 : 0;
        for (int32_t i = 1; i < total3; ++i) {
            const char x = text[i];
            if (text[i - 1] == ' ') {
                if (x == '\'' && i + 1 < total3) {
                    const char x1 = text[i + 1];
                    if (x1 == 't' || x1 == 'd') {  // " 't", " 'd"
                        //total--;  // remove space
                    } else if (x1 == 's' || x1 == 'm') {  // " 's", " 'm"
                        total--;  // remove space
                    } else if (i + 2 < total3) {
                        const char x2 = text[i + 2];
                        if ((x1 == 'l' && x2 == 'l')) {  // " 'll"
                            //total--;  // remove space
                        } else if ((x1 == 'r' && x2 == 'e') || (x1 == 'v' && x2 == 'e')) {  // " 're", " 've"
                            total--;  // remove space
                        } else {
                            //total--;  // remove space
                        }
                    } else {
                        //total--;  // remove space
                    }
                }
            }
            text[total++] = x;
        }
    }

    return total <= text_len_max ? total : -total;
}